

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O1

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConsiderExplicifyingAlgebraic<mp::LinearFunctionalConstraint>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,LinearFunctionalConstraint *con,int i)

{
  _Invoker_type *this_00;
  size_ty sVar1;
  int *piVar2;
  _Invoker_type p_Var3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  this_00 = &this[-8].MarkVarIfLogical_._M_invoker;
  bVar4 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                    ((FlatModel<mp::DefaultFlatModelParams> *)this_00,
                     (con->super_FunctionalConstraint).result_var_);
  if (!bVar4) {
    return false;
  }
  sVar1 = (con->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size;
  bVar4 = sVar1 != 0;
  if (bVar4) {
    piVar2 = (con->affine_expr_).super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    bVar4 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)this_00,*piVar2);
    if (!bVar4) goto LAB_001952d7;
    lVar5 = 4;
    do {
      bVar7 = sVar1 << 2 == lVar5;
      bVar4 = !bVar7;
      if (bVar7) break;
      bVar7 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                        ((FlatModel<mp::DefaultFlatModelParams> *)this_00,
                         *(int *)((long)piVar2 + lVar5));
      lVar5 = lVar5 + 4;
    } while (bVar7);
  }
  if (!bVar4) {
    uVar6 = (ulong)(con->super_FunctionalConstraint).result_var_;
    p_Var3 = this[2].MarkVar_._M_invoker;
    if ((ulong)(*(long *)&this[2].MarkVarIfLogical_.super__Function_base._M_functor - (long)p_Var3
               >> 4) <= uVar6) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
    ::ConvertConstraint((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::LinearFunctionalConstraint>
                         *)&this[0x48].MarkVar_._M_invoker,*(int *)(p_Var3 + uVar6 * 0x10 + 8));
    return true;
  }
LAB_001952d7:
  DoExplicify<mp::LinearFunctionalConstraint,_true>(this,con,i);
  return false;
}

Assistant:

bool ConsiderExplicifyingAlgebraic(const AlgFuncCon& con, int i) {
    if (MPCD( IsProperVar(con.GetResultVar()) )) {
      using TargetCon = AlgebraicConstraint<
          std::decay_t<decltype(con.GetArguments().GetBody())>,
          AlgConRhs<0> >;  // @todo can be ,=, >=
      if (!MPCD( template ModelAPIOk< TargetCon >() )
          || HasExpressionArgs(con.GetArguments())) {
        DoExplicify(con, i);          // as other explicified expressions
        return false;
      }
      auto& ck = GET_CONSTRAINT_KEEPER(AlgFuncCon);
      const auto& ie = MPD( GetInitExpression(con.GetResultVar()) );
      ck.ConvertConstraint(ie.GetIndex());
      return true;
    }
    return false;
  }